

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O2

XMLReader * __thiscall
xercesc_4_0::ReaderMgr::getLastExtEntity(ReaderMgr *this,XMLEntityDecl **itsEntity)

{
  ReaderData *pRVar1;
  XMLSize_t index;
  XMLEntityDecl *pXVar2;
  XMLReader *pXVar3;
  
  pXVar3 = this->fCurReader;
  if ((this->fCurReaderData == (ReaderData *)0x0) ||
     (pXVar2 = this->fCurReaderData->fEntity, pXVar2 == (XMLEntityDecl *)0x0)) {
    pXVar2 = (XMLEntityDecl *)0x0;
  }
  else if (pXVar2->fIsExternal == false) {
    index = (this->fReaderStack->fVector).super_BaseRefVectorOf<xercesc_4_0::ReaderMgr::ReaderData>.
            fCurCount;
    do {
      if (index == 0) goto LAB_002b1437;
      index = index - 1;
      pRVar1 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::elementAt(this->fReaderStack,index);
      pXVar2 = pRVar1->fEntity;
      if (pXVar2 == (XMLEntityDecl *)0x0) {
        pXVar2 = (XMLEntityDecl *)0x0;
        break;
      }
    } while (pXVar2->fIsExternal == false);
    pRVar1 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::elementAt(this->fReaderStack,index);
    pXVar3 = pRVar1->fReader;
  }
LAB_002b1437:
  *itsEntity = pXVar2;
  return pXVar3;
}

Assistant:

const XMLReader*
ReaderMgr::getLastExtEntity(const XMLEntityDecl*& itsEntity) const
{
    //
    //  Scan down the reader stack until we find a reader for an entity that
    //  is external. First check that there is anything in the stack at all,
    //  in which case the current reader is the main file and that's the one
    //  that we want.
    //
    const XMLReader* theReader = fCurReader;

    //
    //  If there is a current entity and it is not an external entity, then
    //  search the stack; else, keep the reader that we've got since its
    //  either an external entity reader or the main file reader.
    //
    const XMLEntityDecl* curEntity =
        fCurReaderData? fCurReaderData->getEntity() : 0;

    if (curEntity && !curEntity->isExternal())
    {
        XMLSize_t index = fReaderStack->size();
        if (index)
        {
            while (true)
            {
                // Move down to the previous element and get a pointer to it
                index--;
                curEntity = fReaderStack->elementAt(index)->getEntity();

                //
                //  If its null or its an external entity, then this reader
                //  is what we want, so break out with that one.
                //
                if (!curEntity)
                {
                    theReader = fReaderStack->elementAt(index)->getReader ();
                    break;
                }
                 else if (curEntity->isExternal())
                {
                    theReader = fReaderStack->elementAt(index)->getReader ();
                    break;
                }

                // We hit the end, so leave the main file reader as the one
                if (!index)
                    break;
            }
        }
    }

    // @@ It feels like we may end up with theReader being from the top of
    //    the stack (fCurReader) and itsEntity being from the bottom of the
    //    stack (if there are no null or external entities on the stack).
    //    Is it a bug?
    //
    itsEntity = curEntity;
    return theReader;
}